

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerConsole.cxx
# Opt level: O3

void __thiscall
cmDebugServerConsole::OnBreakpoint(cmDebugServerConsole *this,breakpoint_id breakpoint)

{
  ostream *poVar1;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"# Breakpoint ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," hit",4);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,PROMPT_abi_cxx11_._M_dataplus._M_p,PROMPT_abi_cxx11_._M_string_length);
  std::__cxx11::stringbuf::str();
  cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return;
}

Assistant:

void cmDebugServerConsole::OnBreakpoint(breakpoint_id breakpoint)
{
  std::stringstream ss;
  ss << "# Breakpoint " << breakpoint << " hit" << std::endl << PROMPT;

  AsyncBroadcast(ss.str());
}